

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.h
# Opt level: O0

TemplateModifier * __thiscall
ctemplate::TemplateModifier::operator()(TemplateModifier *this,char *in,size_t inlen,string *arg)

{
  undefined8 in_R8;
  undefined1 local_58 [8];
  StringEmitter outbuf;
  string *arg_local;
  size_t inlen_local;
  char *in_local;
  TemplateModifier *this_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  StringEmitter::StringEmitter((StringEmitter *)local_58,(string *)this);
  (*(code *)**(undefined8 **)in)(in,inlen,arg,0,local_58,in_R8);
  StringEmitter::~StringEmitter((StringEmitter *)local_58);
  return this;
}

Assistant:

std::string operator()(const char* in, size_t inlen, const std::string& arg="") const {
    std::string out;
    // we'll reserve some space to account for minimal escaping: say 12%
    out.reserve(inlen + inlen/8 + 16);
    StringEmitter outbuf(&out);
    Modify(in, inlen, NULL, &outbuf, arg);
    return out;
  }